

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O3

void __thiscall
LINAnalyzerResults::GenerateFrameTabularText
          (LINAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  bool bVar1;
  undefined1 **ppuVar2;
  string str;
  string fault_str;
  Frame frame;
  char seq_str [128];
  char number_str [128];
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  Frame local_160 [16];
  ulonglong local_150;
  long local_148;
  undefined1 local_140;
  byte local_13f;
  char local_138 [128];
  char local_b8 [136];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_160);
  local_180 = local_170;
  local_178 = 0;
  local_170[0] = 0;
  local_198 = 0;
  local_190[0] = 0;
  local_1a0 = local_190;
  if ((local_13f & 1) != 0) {
    std::__cxx11::string::append((char *)&local_180);
  }
  if ((local_13f & 2) != 0) {
    std::__cxx11::string::append((char *)&local_180);
  }
  if ((local_13f & 4) != 0) {
    std::__cxx11::string::append((char *)&local_180);
  }
  if ((local_13f & 8) != 0) {
    std::__cxx11::string::append((char *)&local_180);
  }
  if (local_178 != 0) {
    ppuVar2 = &local_180;
    std::__cxx11::string::append((char *)ppuVar2);
    goto LAB_00108f71;
  }
  AnalyzerHelpers::GetNumberString(local_150,display_base,8,local_b8,0x80);
  switch(local_140) {
  case 1:
    break;
  case 2:
    break;
  case 3:
    AnalyzerHelpers::GetNumberString((ulong)((uint)local_150 & 0x3f),display_base,8,local_b8,0x80);
  case 6:
switchD_00108e93_caseD_6:
    std::__cxx11::string::append((char *)&local_1a0);
    break;
  case 4:
  case 5:
    AnalyzerHelpers::GetNumberString(local_148 - 1,Decimal,8,local_138,0x80);
    std::__cxx11::string::append((char *)&local_1a0);
    std::__cxx11::string::append((char *)&local_1a0);
    std::__cxx11::string::append((char *)&local_1a0);
    ppuVar2 = &local_1a0;
    std::__cxx11::string::append((char *)ppuVar2);
    goto LAB_00108f71;
  case 7:
    bVar1 = IsFrameChecksum(this,frame_index);
    if (!bVar1) {
      AnalyzerHelpers::GetNumberString(local_148 - 1,Decimal,8,local_138,0x80);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__cxx11::string::append((char *)&local_1a0);
      ppuVar2 = &local_1a0;
      std::__cxx11::string::append((char *)ppuVar2);
      goto LAB_00108f71;
    }
    goto switchD_00108e93_caseD_6;
  }
  ppuVar2 = &local_1a0;
  std::__cxx11::string::append((char *)ppuVar2);
LAB_00108f71:
  AnalyzerResults::AddTabularText
            ((char *)this,*ppuVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  Frame::~Frame(local_160);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    char number_str[ 128 ];
    std::string fault_str;
    std::string str;

    if( frame.mFlags & byteFramingError )
        fault_str += "!FRAME";
    if( frame.mFlags & headerBreakExpected )
        fault_str += "!BREAK";
    if( frame.mFlags & headerSyncExpected )
        fault_str += "!SYNC";
    if( frame.mFlags & checksumMismatch )
        fault_str += "!CHK";
    if( fault_str.length() )
    {
        fault_str += "!";
        AddTabularText( fault_str.c_str() );
    }
    else
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        switch( ( LINAnalyzerResults::tLINFrameState )frame.mType )
        {
        default:
        case LINAnalyzerResults::NoFrame:

            str += "Inter-Byte Space";
            // AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, str, 128 );
            break;

        case LINAnalyzerResults::headerBreak: // expecting break.

            str += "Header Break";
            break;

        case LINAnalyzerResults::headerSync: // expecting sync.

            str += "Header Sync";
            break;

        case LINAnalyzerResults::headerPID: // expecting PID.

            AnalyzerHelpers::GetNumberString( frame.mData1 & 0x3F, display_base, 8, number_str, 128 );
            str += "Protected ID: ";
            str += number_str;
            break;

        // LIN Response
        case LINAnalyzerResults::responseDataZero: // expecting first resppnse data byte.
        case LINAnalyzerResults::responseData:     // expecting response data.
        {
            char seq_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
            str += "Data ";
            str += seq_str;
            str += ": ";
            str += number_str;
        }
        break;
        case LINAnalyzerResults::responseChecksum: // expecting checksum.
            str += "Checksum: ";
            str += number_str;
            break;
        case LINAnalyzerResults::responsePotentialChecksum:
            if( IsFrameChecksum( frame_index ) )
            {
                str += "Checksum: ";
                str += number_str;
            }
            else
            {
                char seq_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
                str += "Data ";
                str += seq_str;
                str += ": ";
                str += number_str;
            }

            break;
        }

        AddTabularText( str.c_str() );
    }
}